

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O1

float memory_tree_ns::get_overlap_from_two_examples(example *ec1,example *ec2)

{
  float fVar1;
  wclass *pwVar2;
  wclass *pwVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  
  pwVar2 = (ec1->l).cs.costs._begin;
  qsort(pwVar2,(long)(ec1->l).cs.costs._end - (long)pwVar2 >> 2,4,compare_label);
  pwVar2 = (ec2->l).cs.costs._begin;
  qsort(pwVar2,(long)(ec2->l).cs.costs._end - (long)pwVar2 >> 2,4,compare_label);
  pwVar2 = (ec1->l).cs.costs._begin;
  lVar4 = (long)(ec1->l).cs.costs._end - (long)pwVar2;
  if (lVar4 == 0) {
    fVar9 = 0.0;
  }
  else {
    pwVar3 = (ec2->l).cs.costs._begin;
    uVar8 = 0;
    uVar5 = 0;
    uVar6 = 0;
    uVar7 = 0;
    do {
      if ((ulong)((long)(ec2->l).cs.costs._end - (long)pwVar3 >> 2) <= (ulong)uVar7) break;
      fVar9 = (&pwVar3->x)[uVar7];
      fVar1 = (&pwVar2->x)[uVar8];
      if ((uint)fVar1 < (uint)fVar9) {
        uVar6 = uVar6 + 1;
      }
      else {
        if ((uint)fVar1 <= (uint)fVar9) {
          uVar5 = uVar5 + 1;
          uVar6 = uVar6 + 1;
        }
        uVar7 = uVar7 + 1;
      }
      uVar8 = (ulong)uVar6;
    } while (uVar8 < (ulong)(lVar4 >> 2));
    fVar9 = (float)uVar5;
  }
  return fVar9;
}

Assistant:

float get_overlap_from_two_examples(example& ec1, example& ec2){
        return (float)over_lap(ec1.l.multilabels.label_v, ec2.l.multilabels.label_v);
    }